

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int lj_cf_string_format(lua_State *L)

{
  double dVar1;
  char cVar2;
  TValue *pTVar3;
  cTValue *pcVar4;
  TValue *pTVar5;
  GCRef *pGVar6;
  lua_State *plVar7;
  int iVar8;
  uint uVar9;
  GCstr *pGVar10;
  void *pvVar11;
  size_t sVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  cTValue *pcVar16;
  GCstr *pGVar17;
  byte *pbVar18;
  ulong uVar19;
  byte *pbVar20;
  long lVar21;
  int iVar22;
  byte bVar23;
  cTValue *o;
  byte *__src;
  bool bVar24;
  char form [18];
  TValue tv;
  char nbuf [32];
  char buff [512];
  undefined8 uStack_22b0;
  char local_22a8 [24];
  lua_State *local_2290;
  ulong local_2288;
  ulong local_2280;
  GCstr *local_2278;
  cTValue local_2270;
  char local_2268 [32];
  char local_2248 [512];
  luaL_Buffer local_2048;
  
  local_2280 = (long)L->top - (long)L->base;
  uStack_22b0 = (code *)0x144d2d;
  pGVar10 = lj_lib_checkstr(L,1);
  local_2048.p = local_2048.buffer;
  local_2048.lvl = 0;
  local_2048.L = L;
  if ((ulong)pGVar10->len != 0) {
    local_2280 = local_2280 >> 3;
    local_2278 = (GCstr *)((long)&pGVar10[1].nextgc.gcptr32 + (ulong)pGVar10->len);
    pGVar10 = pGVar10 + 1;
    iVar8 = 1;
    do {
      iVar22 = iVar8;
      if ((byte)(pGVar10->nextgc).gcptr32 != 0x25) {
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          uStack_22b0 = (code *)0x144dfe;
          iVar8 = emptybuffer(&local_2048);
          if (iVar8 != 0) {
            uStack_22b0 = (code *)0x144e0f;
            adjuststack(&local_2048);
          }
        }
        pGVar6 = &pGVar10->nextgc;
        pGVar10 = (GCstr *)((long)&(pGVar10->nextgc).gcptr32 + 1);
        *local_2048.p = (byte)pGVar6->gcptr32;
        local_2048.p = local_2048.p + 1;
        goto LAB_00145065;
      }
      bVar23 = *(byte *)((long)&(pGVar10->nextgc).gcptr32 + 1);
      if (bVar23 == 0x25) {
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          uStack_22b0 = (code *)0x144da6;
          iVar8 = emptybuffer(&local_2048);
          if (iVar8 != 0) {
            uStack_22b0 = (code *)0x144db7;
            adjuststack(&local_2048);
          }
        }
        pGVar6 = &pGVar10->nextgc;
        pGVar10 = (GCstr *)((long)&(pGVar10->nextgc).gcptr32 + 2);
        *local_2048.p = *(byte *)((long)&pGVar6->gcptr32 + 1);
        local_2048.p = local_2048.p + 1;
        goto LAB_00145065;
      }
      iVar22 = iVar8 + 1;
      if ((int)local_2280 <= iVar8) {
        uStack_22b0 = (code *)0x14561e;
        err_argmsg(L,iVar22,"no value");
      }
      __src = (byte *)((long)&(pGVar10->nextgc).gcptr32 + 1);
      pbVar20 = __src;
      if (bVar23 == 0) {
        uVar19 = 0;
      }
      else {
        do {
          uStack_22b0 = (code *)0x144e5f;
          pvVar11 = memchr("-+ #0",(int)(char)bVar23,6);
          if (pvVar11 == (void *)0x0) goto LAB_00144e73;
          bVar23 = pbVar20[1];
          pbVar20 = pbVar20 + 1;
        } while (bVar23 != 0);
        bVar23 = 0;
LAB_00144e73:
        uVar19 = (ulong)bVar23;
      }
      if (5 < (ulong)((long)pbVar20 - (long)__src)) {
        uStack_22b0 = (code *)0x145638;
        lj_err_caller(L,LJ_ERR_STRFMTR);
      }
      uVar19 = (ulong)(""[uVar19 + 1] >> 3 & 1);
      pbVar20 = pbVar20 + ((""[(ulong)pbVar20[uVar19] + 1] >> 3 & 1) != 0) + uVar19;
      bVar23 = *pbVar20;
      if (bVar23 == 0x2e) {
        bVar24 = (""[(ulong)pbVar20[1] + 1] & 8) == 0;
        pbVar18 = pbVar20 + 2;
        if (bVar24) {
          pbVar18 = pbVar20 + 1;
        }
        pbVar20 = pbVar18 + ((""[(ulong)pbVar20[2 - (ulong)bVar24] + 1] >> 3 & 1) != 0);
        bVar23 = *pbVar20;
      }
      if ((""[(ulong)bVar23 + 1] & 8) != 0) {
        uStack_22b0 = (code *)0x14562b;
        lj_err_caller(L,LJ_ERR_STRFMTW);
      }
      local_22a8[0] = '%';
      uStack_22b0 = (code *)0x144f0f;
      strncpy(local_22a8 + 1,(char *)__src,(size_t)(pbVar20 + (1 - (long)__src)));
      pbVar20[(long)(local_22a8 + (2 - (long)__src))] = 0;
      pGVar10 = (GCstr *)(pbVar20 + 1);
      bVar23 = *pbVar20;
      if (bVar23 < 0x58) {
        if (((bVar23 != 0x41) && (bVar23 != 0x45)) && (bVar23 != 0x47))
        goto switchD_00144f42_caseD_59;
switchD_00144f42_caseD_61:
        uStack_22b0 = (code *)0x144fcb;
        local_2270.n = lj_lib_checknum(L,iVar22);
        if (0x7fefffffffffffff < (ulong)ABS(local_2270.n)) {
          uStack_22b0 = (code *)0x145413;
          sVar14 = lj_str_bufnum(local_2268,&local_2270);
          if ((char)*pbVar20 < 'a') {
            local_2268[sVar14 - 3] = local_2268[sVar14 - 3] + -0x20;
            local_2268[sVar14 - 2] = local_2268[sVar14 - 2] + -0x20;
            local_2268[sVar14 - 1] = local_2268[sVar14 - 1] + -0x20;
          }
          local_2268[sVar14] = '\0';
          pcVar13 = local_22a8;
          do {
            pcVar15 = pcVar13;
            if ('@' < *pcVar15) break;
            pcVar13 = pcVar15 + 1;
          } while (*pcVar15 != '.');
          pcVar15[0] = 's';
          pcVar15[1] = '\0';
          pcVar13 = local_2268;
          goto LAB_00145043;
        }
        uStack_22b0 = (code *)0x145000;
        sprintf(local_2248,local_22a8);
        goto LAB_0014504a;
      }
      switch(bVar23) {
      case 0x58:
      case 0x6f:
      case 0x75:
      case 0x78:
        uStack_22b0 = (code *)0x144f4f;
        sVar12 = strlen(local_22a8);
        cVar2 = local_22a8[sVar12 - 1];
        (local_22a8 + (sVar12 - 1))[0] = 'l';
        (local_22a8 + (sVar12 - 1))[1] = '\0';
        local_22a8[sVar12] = cVar2;
        local_22a8[sVar12 + 1] = '\0';
        uStack_22b0 = (code *)0x144f6c;
        lj_lib_checknum(L,iVar22);
        dVar1 = L->base[(long)iVar22 + -1].n;
        pcVar13 = (char *)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1
                          );
        if (*(int *)((long)L->base + (long)iVar22 * 8 + -4) < 0) {
          pcVar13 = (char *)(long)dVar1;
        }
        goto LAB_00145043;
      default:
switchD_00144f42_caseD_59:
        uStack_22b0 = writer_buf;
        lj_err_callerv(L,LJ_ERR_STRFMTO,(ulong)(uint)(int)(char)bVar23);
      case 0x61:
      case 0x65:
      case 0x66:
      case 0x67:
        goto switchD_00144f42_caseD_61;
      case 99:
        uStack_22b0 = (code *)0x1450ae;
        uVar9 = lj_lib_checkint(L,iVar22);
        uStack_22b0 = (code *)0x1450c2;
        sprintf(local_2248,local_22a8,(ulong)uVar9);
        goto LAB_0014504a;
      case 100:
      case 0x69:
        uStack_22b0 = (code *)0x14500d;
        sVar12 = strlen(local_22a8);
        cVar2 = local_22a8[sVar12 - 1];
        (local_22a8 + (sVar12 - 1))[0] = 'l';
        (local_22a8 + (sVar12 - 1))[1] = '\0';
        local_22a8[sVar12] = cVar2;
        local_22a8[sVar12 + 1] = '\0';
        uStack_22b0 = (code *)0x14502a;
        lj_lib_checknum(L,iVar22);
        pcVar13 = (char *)(long)L->base[(long)iVar22 + -1].n;
LAB_00145043:
        uStack_22b0 = (code *)0x14504a;
        sprintf(local_2248,local_22a8,pcVar13);
LAB_0014504a:
        uStack_22b0 = (code *)0x145052;
        sVar12 = strlen(local_2248);
        uStack_22b0 = (code *)0x145065;
        luaL_addlstring(&local_2048,local_2248,sVar12);
        break;
      case 0x70:
        uStack_22b0 = (code *)0x145081;
        pvVar11 = lua_topointer(L,iVar22);
        uStack_22b0 = (code *)0x145095;
        lj_str_pushf(L,"%p",pvVar11);
        uStack_22b0 = (code *)0x1450a2;
        luaL_addvalue(&local_2048);
        break;
      case 0x71:
        uStack_22b0 = (code *)0x145147;
        local_2290 = L;
        pGVar17 = lj_lib_checkstr(L,iVar22);
        local_2288 = (ulong)pGVar17->len;
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          uStack_22b0 = (code *)0x145171;
          iVar8 = emptybuffer(&local_2048);
          if (iVar8 != 0) {
            uStack_22b0 = (code *)0x145182;
            adjuststack(&local_2048);
          }
        }
        pcVar13 = local_2048.p + 1;
        *local_2048.p = 0x22;
        local_2048.p = pcVar13;
        if (local_2288 != 0) {
          lVar21 = 0;
          do {
            bVar23 = *(byte *)((long)&pGVar17[1].nextgc.gcptr32 + lVar21);
            uVar9 = (uint)bVar23;
            if (((bVar23 == 10) || (bVar23 == 0x5c)) || (bVar23 == 0x22)) {
              if (&stack0xffffffffffffffd0 <= local_2048.p) {
                uStack_22b0 = (code *)0x1451e2;
                iVar8 = emptybuffer(&local_2048);
                if (iVar8 != 0) {
                  uStack_22b0 = (code *)0x1451f3;
                  adjuststack(&local_2048);
                }
              }
              *local_2048.p = 0x5c;
              local_2048.p = local_2048.p + 1;
            }
            else if ((""[(ulong)bVar23 + 1] & 1) != 0) {
              if (&stack0xffffffffffffffd0 <= local_2048.p) {
                uStack_22b0 = (code *)0x14528a;
                iVar8 = emptybuffer(&local_2048);
                if (iVar8 != 0) {
                  uStack_22b0 = (code *)0x14529b;
                  adjuststack(&local_2048);
                }
              }
              pcVar13 = local_2048.p + 1;
              *local_2048.p = 0x5c;
              local_2048.p = pcVar13;
              if ((bVar23 < 100) &&
                 ((""[(ulong)*(byte *)((long)&pGVar17[1].nextgc.gcptr32 + lVar21 + 1) + 1] & 8) == 0
                 )) {
                if (9 < bVar23) goto LAB_0014532d;
              }
              else {
                if (&stack0xffffffffffffffd0 <= pcVar13) {
                  uStack_22b0 = (code *)0x1452f0;
                  iVar8 = emptybuffer(&local_2048);
                  if (iVar8 != 0) {
                    uStack_22b0 = (code *)0x145301;
                    adjuststack(&local_2048);
                  }
                }
                uVar9 = bVar23 - 100;
                if (99 >= bVar23) {
                  uVar9 = (uint)bVar23;
                }
                *local_2048.p = 99 < bVar23 | 0x30;
                local_2048.p = local_2048.p + 1;
LAB_0014532d:
                if (&stack0xffffffffffffffd0 <= local_2048.p) {
                  uStack_22b0 = (code *)0x14534c;
                  iVar8 = emptybuffer(&local_2048);
                  if (iVar8 != 0) {
                    uStack_22b0 = (code *)0x14535d;
                    adjuststack(&local_2048);
                  }
                }
                cVar2 = (char)(uVar9 * 0xcd >> 0xb);
                bVar23 = cVar2 * -10 + (char)uVar9;
                *local_2048.p = cVar2 + 0x30;
                local_2048.p = local_2048.p + 1;
              }
              bVar23 = bVar23 + 0x30;
            }
            if (&stack0xffffffffffffffd0 <= local_2048.p) {
              uStack_22b0 = (code *)0x145229;
              iVar8 = emptybuffer(&local_2048);
              if (iVar8 != 0) {
                uStack_22b0 = (code *)0x14523a;
                adjuststack(&local_2048);
              }
            }
            pcVar13 = local_2048.p + 1;
            *local_2048.p = bVar23;
            lVar21 = lVar21 + 1;
            local_2048.p = pcVar13;
          } while ((int)local_2288 != (int)lVar21);
        }
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          uStack_22b0 = (code *)0x1453b3;
          iVar8 = emptybuffer(&local_2048);
          if (iVar8 != 0) {
            uStack_22b0 = (code *)0x1453c4;
            adjuststack(&local_2048);
          }
        }
        *local_2048.p = 0x22;
        L = local_2290;
        local_2048.p = local_2048.p + 1;
        break;
      case 0x73:
        lVar21 = (long)iVar22;
        o = L->base + lVar21 + -1;
        if (*(int *)((long)L->base + lVar21 * 8 + -4) == -5) {
          pGVar17 = (GCstr *)(ulong)(o->u32).lo;
          goto LAB_001450e5;
        }
        uStack_22b0 = (code *)0x145473;
        local_2290 = L;
        pcVar16 = lj_meta_lookup(L,o,MM_tostring);
        plVar7 = local_2290;
        if ((pcVar16->field_2).it != 0xffffffff) {
          pcVar4 = local_2290->top;
          local_2290->top = pcVar4 + 1;
          *pcVar4 = *pcVar16;
          pTVar3 = local_2290->top;
          local_2290->top = pTVar3 + 1;
          pTVar3->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)o;
          uStack_22b0 = (code *)0x1454b8;
          lj_vm_call(local_2290,local_2290->top + -1,2);
          pTVar5 = plVar7->top;
          pTVar3 = pTVar5 + -1;
          plVar7->top = pTVar3;
          if (*(int *)((long)pTVar5 + -4) == -5) {
            pGVar17 = (GCstr *)(ulong)(pTVar3->u32).lo;
            goto LAB_001450e5;
          }
          o = L->base + lVar21 + -1;
          *o = (cTValue)*(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar3;
        }
        uVar9 = (o->field_2).it;
        if (uVar9 < 0xffff0000) {
          uStack_22b0 = (code *)0x1454fc;
          pGVar17 = lj_str_fromnumber(L,o);
          goto LAB_001450e5;
        }
        switch(uVar9 & 0xffff) {
        case 0xfff7:
          if (*(byte *)((ulong)(o->u32).lo + 6) < 2) {
LAB_00145592:
            uVar19 = (ulong)~uVar9;
            goto LAB_00145597;
          }
          uStack_22b0 = (code *)0x14553a;
          lj_str_pushf(L,"function: builtin#%d");
          goto LAB_001455c3;
        default:
          uVar19 = 3;
          if ((uVar9 & 0xffff8000) != 0xffff0000) goto LAB_00145592;
LAB_00145597:
          pcVar13 = lj_obj_itypename[uVar19];
          uStack_22b0 = (code *)0x1455ac;
          pvVar11 = lua_topointer(L,iVar22);
          uStack_22b0 = (code *)0x1455c3;
          lj_str_pushf(L,"%s: %p",pcVar13,pvVar11);
LAB_001455c3:
          pTVar3 = L->top;
          L->top = pTVar3 + -1;
          pGVar17 = (GCstr *)(ulong)pTVar3[-1].u32.lo;
          goto LAB_001450e5;
        case 0xfffd:
          sVar14 = 4;
          pcVar13 = "true";
          break;
        case 0xfffe:
          sVar14 = 5;
          pcVar13 = "false";
          break;
        case 0xffff:
          sVar14 = 3;
          pcVar13 = "nil";
        }
        uStack_22b0 = (code *)0x145575;
        pGVar17 = lj_str_new(L,pcVar13,sVar14);
LAB_001450e5:
        uStack_22b0 = (code *)0x1450f7;
        pcVar13 = strchr(local_22a8,0x2e);
        if ((pcVar13 == (char *)0x0) && (99 < pGVar17->len)) {
          pTVar3 = L->top;
          L->top = pTVar3 + 1;
          (pTVar3->u32).lo = (uint32_t)pGVar17;
          (pTVar3->field_2).it = 0xfffffffb;
          uStack_22b0 = (code *)0x145133;
          luaL_addvalue(&local_2048);
          break;
        }
        uStack_22b0 = (code *)0x1453f9;
        sprintf(local_2248,local_22a8,pGVar17 + 1);
        goto LAB_0014504a;
      }
LAB_00145065:
      iVar8 = iVar22;
    } while (pGVar10 < local_2278);
  }
  uStack_22b0 = (code *)0x1455ea;
  emptybuffer(&local_2048);
  uStack_22b0 = (code *)0x1455f6;
  lua_concat(local_2048.L,local_2048.lvl);
  return 1;
}

Assistant:

LJLIB_CF(string_format)
{
  int arg = 1, top = (int)(L->top - L->base);
  GCstr *fmt = lj_lib_checkstr(L, arg);
  const char *strfrmt = strdata(fmt);
  const char *strfrmt_end = strfrmt + fmt->len;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC) {
      luaL_addchar(&b, *strfrmt++);
    } else if (*++strfrmt == L_ESC) {
      luaL_addchar(&b, *strfrmt++);  /* %% */
    } else { /* format item */
      char form[MAX_FMTSPEC];  /* to store the format (`%...') */
      char buff[MAX_FMTITEM];  /* to store the formatted item */
      if (++arg > top)
	luaL_argerror(L, arg, lj_obj_typename[0]);
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
      case 'c':
	sprintf(buff, form, lj_lib_checkint(L, arg));
	break;
      case 'd':  case 'i':
	addintlen(form);
	sprintf(buff, form, num2intfrm(L, arg));
	break;
      case 'o':  case 'u':  case 'x':  case 'X':
	addintlen(form);
	sprintf(buff, form, num2uintfrm(L, arg));
	break;
      case 'e':  case 'E': case 'f': case 'g': case 'G': case 'a': case 'A': {
	TValue tv;
	tv.n = lj_lib_checknum(L, arg);
	if (LJ_UNLIKELY((tv.u32.hi << 1) >= 0xffe00000)) {
	  /* Canonicalize output of non-finite values. */
	  char *p, nbuf[LJ_STR_NUMBUF];
	  size_t len = lj_str_bufnum(nbuf, &tv);
	  if (strfrmt[-1] < 'a') {
	    nbuf[len-3] = nbuf[len-3] - 0x20;
	    nbuf[len-2] = nbuf[len-2] - 0x20;
	    nbuf[len-1] = nbuf[len-1] - 0x20;
	  }
	  nbuf[len] = '\0';
	  for (p = form; *p < 'A' && *p != '.'; p++) ;
	  *p++ = 's'; *p = '\0';
	  sprintf(buff, form, nbuf);
	  break;
	}
	sprintf(buff, form, (double)tv.n);
	break;
	}
      case 'q':
	addquoted(L, &b, arg);
	continue;
      case 'p':
	lj_str_pushf(L, "%p", lua_topointer(L, arg));
	luaL_addvalue(&b);
	continue;
      case 's': {
	GCstr *str = meta_tostring(L, arg);
	if (!strchr(form, '.') && str->len >= 100) {
	  /* no precision and string is too long to be formatted;
	     keep original string */
	  setstrV(L, L->top++, str);
	  luaL_addvalue(&b);
	  continue;
	}
	sprintf(buff, form, strdata(str));
	break;
	}
      default:
	lj_err_callerv(L, LJ_ERR_STRFMTO, *(strfrmt -1));
	break;
      }
      luaL_addlstring(&b, buff, strlen(buff));
    }
  }
  luaL_pushresult(&b);
  return 1;
}